

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  long lVar1;
  long *plVar2;
  undefined8 uVar3;
  long lVar4;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  if (*(long *)(this + 0x48) == 0) {
    uVar3 = (**(code **)(**(long **)(default_device + 0x10) + 0x10))
                      (*(long **)(default_device + 0x10),*(long *)(this + 8) - *(long *)this >> 1);
    *(undefined8 *)(this + 0x48) = uVar3;
  }
  lVar4 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  lVar5 = 0;
  lVar7 = 0;
  for (lVar6 = 0; lVar4 + lVar6 != lVar1; lVar6 = lVar6 + 8) {
    plVar2 = *(long **)(lVar4 + lVar5 * 2);
    (**(code **)(*plVar2 + 0x10))(plVar2,*(long *)(this + 0x48) + lVar5);
    lVar7 = lVar7 + -1;
    lVar5 = lVar5 + 4;
  }
  dVar8 = 0.0;
  for (lVar4 = 0; -lVar4 != lVar7; lVar4 = lVar4 + 1) {
    dVar8 = dVar8 + (double)*(float *)(*(long *)(this + 0x48) + lVar4 * 4);
  }
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  return (float)dVar8;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)default_device->mem->malloc(all_params.size() * sizeof(float));
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}